

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::GenerateNodeGraph
          (LWOImporter *this,
          map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
          *apcNodes)

{
  float fVar1;
  unsigned_short uVar2;
  aiNode *paVar3;
  bool bVar4;
  aiNode *paVar5;
  aiNode *this_00;
  mapped_type *ppaVar6;
  pointer ppVar7;
  aiNode **ppaVar8;
  DeadlyImportError *this_01;
  undefined1 local_198 [8];
  FlipWindingOrderProcess flipper;
  MakeLeftHandedProcess maker;
  aiNode *pc;
  string local_158;
  _Self local_138;
  _Self local_130;
  iterator itMapChildNodes_1;
  iterator iStack_120;
  uint16_t p;
  _Self local_118;
  iterator itMapChildNodes;
  _Self local_108;
  iterator itMapParentNodes;
  _Self local_f8;
  _Self local_f0;
  iterator itMapPivot;
  _Self local_e0;
  _Self local_d8;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  aiNode *local_88;
  aiNode *pivotNode;
  aiNode *paStack_78;
  uint16_t parentIndex;
  Layer *nodeLayer;
  _Self local_68;
  iterator itapcNodes;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  mapPivot;
  aiNode *root;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  *apcNodes_local;
  LWOImporter *this_local;
  
  paVar5 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar5);
  this->pScene->mRootNode = paVar5;
  aiString::Set((aiString *)paVar5,"<LWORoot>");
  std::
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  ::map((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         *)&itapcNodes);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
       ::begin(apcNodes);
  while( true ) {
    nodeLayer = (Layer *)std::
                         map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                         ::end(apcNodes);
    bVar4 = std::operator!=(&local_68,(_Self *)&nodeLayer);
    if (!bVar4) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    paStack_78 = ppVar7->second->mParent;
    pivotNode._6_2_ = *(undefined2 *)((paStack_78->mName).data + 0x11c);
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    local_88 = this_00;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    paVar3 = ppVar7->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,(paVar3->mName).data,&local_c9);
    std::operator+(&local_a8,"Pivot-",&local_c8);
    aiString::Set((aiString *)this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    paVar3 = local_88;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    ppVar7->second->mParent = paVar3;
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         ::find(apcNodes,(key_type_conflict1 *)((long)&pivotNode + 6));
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         ::end(apcNodes);
    bVar4 = std::operator!=(&local_d8,&local_e0);
    if (bVar4) {
      ppaVar6 = std::
                map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                ::operator[](apcNodes,(key_type_conflict1 *)((long)&pivotNode + 6));
      local_88->mParent = *ppaVar6;
    }
    else {
      local_88->mParent = paVar5;
    }
    fVar1 = *(float *)((paStack_78->mName).data + 0x144);
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    (ppVar7->second->mTransformation).a4 = -fVar1;
    fVar1 = *(float *)((paStack_78->mName).data + 0x148);
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    (ppVar7->second->mTransformation).b4 = -fVar1;
    fVar1 = *(float *)((paStack_78->mName).data + 0x14c);
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    paVar3 = local_88;
    (ppVar7->second->mTransformation).c4 = -fVar1;
    (local_88->mTransformation).a4 = *(float *)((paStack_78->mName).data + 0x144);
    (local_88->mTransformation).b4 = *(float *)((paStack_78->mName).data + 0x148);
    (local_88->mTransformation).c4 = *(float *)((paStack_78->mName).data + 0x14c);
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_68);
    itMapPivot._M_node._6_2_ = -2 - ppVar7->first;
    ppaVar6 = std::
              map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
              ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                            *)&itapcNodes,(key_type_conflict1 *)((long)&itMapPivot._M_node + 6));
    *ppaVar6 = paVar3;
    std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator++(&local_68);
  }
  local_f0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
       ::begin((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                *)&itapcNodes);
  while( true ) {
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         ::end((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                *)&itapcNodes);
    bVar4 = std::operator!=(&local_f0,&local_f8);
    if (!bVar4) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_f0);
    paVar3 = ppVar7->second;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_f0);
    ppaVar6 = std::
              map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
              ::operator[](apcNodes,&ppVar7->first);
    *ppaVar6 = paVar3;
    std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator++(&local_f0);
  }
  itMapParentNodes._M_node._6_2_ = 0xffff;
  ppaVar6 = std::
            map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
            ::operator[](apcNodes,(key_type_conflict1 *)((long)&itMapParentNodes._M_node + 6));
  *ppaVar6 = paVar5;
  local_108._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
       ::begin(apcNodes);
  while( true ) {
    itMapChildNodes =
         std::
         map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         ::end(apcNodes);
    bVar4 = std::operator!=(&local_108,&itMapChildNodes);
    if (!bVar4) break;
    local_118._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         ::begin(apcNodes);
    while( true ) {
      iStack_120 = std::
                   map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                   ::end(apcNodes);
      bVar4 = std::operator!=(&local_118,&stack0xfffffffffffffee0);
      if (!bVar4) break;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                         (&local_108);
      uVar2 = ppVar7->first;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                         (&local_118);
      if (uVar2 != ppVar7->first) {
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                           (&local_108);
        paVar5 = ppVar7->second;
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                           (&local_118);
        if (paVar5 == ppVar7->second->mParent) {
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                             (&local_108);
          ppVar7->second->mNumChildren = ppVar7->second->mNumChildren + 1;
        }
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator++(&local_118);
    }
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                       (&local_108);
    if (ppVar7->second->mNumChildren != 0) {
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                         (&local_108);
      ppaVar8 = (aiNode **)operator_new__((ulong)ppVar7->second->mNumChildren << 3);
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                         (&local_108);
      ppVar7->second->mChildren = ppaVar8;
      itMapChildNodes_1._M_node._6_2_ = 0;
      local_130._M_node =
           (_Base_ptr)
           std::
           map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
           ::begin(apcNodes);
      while( true ) {
        local_138._M_node =
             (_Base_ptr)
             std::
             map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
             ::end(apcNodes);
        bVar4 = std::operator!=(&local_130,&local_138);
        if (!bVar4) break;
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                           (&local_108);
        uVar2 = ppVar7->first;
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                           (&local_130);
        if (uVar2 != ppVar7->first) {
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                             (&local_108);
          paVar5 = ppVar7->second;
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                             (&local_130);
          if (paVar5 == ppVar7->second->mParent) {
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                               (&local_130);
            paVar5 = ppVar7->second;
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator->
                               (&local_108);
            ppVar7->second->mChildren[itMapChildNodes_1._M_node._6_2_] = paVar5;
            itMapChildNodes_1._M_node._6_2_ = itMapChildNodes_1._M_node._6_2_ + 1;
          }
        }
        std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator++(&local_130);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_short,_aiNode_*>_>::operator++(&local_108);
  }
  if (this->pScene->mRootNode->mNumChildren != 0) {
    if (this->pScene->mRootNode->mNumChildren == 1) {
      paVar5 = *this->pScene->mRootNode->mChildren;
      *this->pScene->mRootNode->mChildren = (aiNode *)0x0;
      paVar5->mParent = (aiNode *)0x0;
      paVar3 = this->pScene->mRootNode;
      if (paVar3 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar3);
        operator_delete(paVar3,0x478);
      }
      this->pScene->mRootNode = paVar5;
    }
    MakeLeftHandedProcess::MakeLeftHandedProcess
              ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress);
    MakeLeftHandedProcess::Execute
              ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress,this->pScene);
    FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_198);
    FlipWindingOrderProcess::Execute((FlipWindingOrderProcess *)local_198,this->pScene);
    FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_198);
    MakeLeftHandedProcess::~MakeLeftHandedProcess
              ((MakeLeftHandedProcess *)&flipper.super_BaseProcess.progress);
    std::
    map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
    ::~map((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
            *)&itapcNodes);
    return;
  }
  pc._6_1_ = 1;
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"LWO: Unable to build a valid node graph",
             (allocator<char> *)((long)&pc + 7));
  DeadlyImportError::DeadlyImportError(this_01,&local_158);
  pc._6_1_ = 0;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::GenerateNodeGraph(std::map<uint16_t,aiNode*>& apcNodes)
{
    // now generate the final nodegraph - generate a root node and attach children
    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<LWORoot>");

    //Set parent of all children, inserting pivots
    //std::cout << "Set parent of all children" << std::endl;
    std::map<uint16_t, aiNode*> mapPivot;
    for (auto itapcNodes = apcNodes.begin(); itapcNodes != apcNodes.end(); ++itapcNodes) {

        //Get the parent index
        LWO::Layer* nodeLayer = (LWO::Layer*)(itapcNodes->second->mParent);
        uint16_t parentIndex = nodeLayer->mParent;

        //Create pivot node, store it into the pivot map, and set the parent as the pivot
        aiNode* pivotNode = new aiNode();
        pivotNode->mName.Set("Pivot-"+std::string(itapcNodes->second->mName.data));
        itapcNodes->second->mParent = pivotNode;

        //Look for the parent node to attach the pivot to
        if (apcNodes.find(parentIndex) != apcNodes.end()) {
            pivotNode->mParent = apcNodes[parentIndex];
        } else {
            //If not, attach to the root node
            pivotNode->mParent = root;
        }

        //Set the node and the pivot node transformation
        itapcNodes->second->mTransformation.a4 = -nodeLayer->mPivot.x;
        itapcNodes->second->mTransformation.b4 = -nodeLayer->mPivot.y;
        itapcNodes->second->mTransformation.c4 = -nodeLayer->mPivot.z;
        pivotNode->mTransformation.a4 = nodeLayer->mPivot.x;
        pivotNode->mTransformation.b4 = nodeLayer->mPivot.y;
        pivotNode->mTransformation.c4 = nodeLayer->mPivot.z;
        mapPivot[-(itapcNodes->first+2)] = pivotNode;
    }

    //Merge pivot map into node map
    //std::cout << "Merge pivot map into node map" << std::endl;
    for (auto itMapPivot = mapPivot.begin(); itMapPivot != mapPivot.end(); ++itMapPivot) {
        apcNodes[itMapPivot->first] = itMapPivot->second;
    }

    //Set children of all parents
    apcNodes[-1] = root;
    for (auto itMapParentNodes = apcNodes.begin(); itMapParentNodes != apcNodes.end(); ++itMapParentNodes) {
        for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
            if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                ++(itMapParentNodes->second->mNumChildren);
            }
        }
        if (itMapParentNodes->second->mNumChildren) {
            itMapParentNodes->second->mChildren = new aiNode* [ itMapParentNodes->second->mNumChildren ];
            uint16_t p = 0;
            for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
                if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                    itMapParentNodes->second->mChildren[p++] = itMapChildNodes->second;
                }
            }
        }
    }

    if (!pScene->mRootNode->mNumChildren)
        throw DeadlyImportError("LWO: Unable to build a valid node graph");

    // Remove a single root node with no meshes assigned to it ...
    if (1 == pScene->mRootNode->mNumChildren)   {
        aiNode* pc = pScene->mRootNode->mChildren[0];
        pc->mParent = pScene->mRootNode->mChildren[0] = NULL;
        delete pScene->mRootNode;
        pScene->mRootNode = pc;
    }

    // convert the whole stuff to RH with CCW winding
    MakeLeftHandedProcess maker;
    maker.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}